

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O3

bool __thiscall FOptionMenuFieldBase::SetString(FOptionMenuFieldBase *this,int i,char *s)

{
  if ((i == 0) && (this->mCVar != (FBaseCVar *)0x0)) {
    FBaseCVar::SetGenericRep(this->mCVar,(UCVarValue)s,CVAR_String);
  }
  return i == 0;
}

Assistant:

bool SetString ( int i, const char* s )
	{
		if ( i == 0 )
		{
			if ( mCVar )
			{
				UCVarValue vval;
				vval.String = s;
				mCVar->SetGenericRep( vval, CVAR_String );
			}

			return true;
		}

		return false;
	}